

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O0

int Cudd_bddPickOneCube(DdManager *ddm,DdNode *node,char *string)

{
  DdNode *pDVar1;
  char cVar2;
  DdNode *pDVar3;
  uint *puVar4;
  ulong uVar5;
  DdNode *local_60;
  int local_58;
  int i;
  char dir;
  DdNode *bzero;
  DdNode *one;
  DdNode *E;
  DdNode *T;
  DdNode *N;
  char *string_local;
  DdNode *node_local;
  DdManager *ddm_local;
  
  if ((string == (char *)0x0) || (node == (DdNode *)0x0)) {
    ddm_local._4_4_ = 0;
  }
  else {
    pDVar1 = ddm->one;
    pDVar3 = (DdNode *)((ulong)pDVar1 ^ 1);
    if (node == pDVar3) {
      ddm_local._4_4_ = 0;
    }
    else {
      for (local_58 = 0; string_local = (char *)node, local_58 < ddm->size; local_58 = local_58 + 1)
      {
        string[local_58] = '\x02';
      }
      while ((DdNode *)string_local != pDVar1) {
        puVar4 = (uint *)((ulong)string_local & 0xfffffffffffffffe);
        E = *(DdNode **)(puVar4 + 4);
        one = *(DdNode **)(puVar4 + 6);
        if (((ulong)string_local & 1) != 0) {
          E = (DdNode *)((ulong)E ^ 1);
          one = (DdNode *)((ulong)one ^ 1);
        }
        if (E == pDVar3) {
          string[*puVar4] = '\0';
          string_local = (char *)one;
        }
        else if (one == pDVar3) {
          string[*puVar4] = '\x01';
          string_local = (char *)E;
        }
        else {
          uVar5 = Cudd_Random();
          cVar2 = (char)((long)(uVar5 & 0x2000) >> 0xd);
          string[*puVar4] = cVar2;
          if (cVar2 == '\0') {
            local_60 = one;
          }
          else {
            local_60 = E;
          }
          string_local = (char *)local_60;
        }
      }
      ddm_local._4_4_ = 1;
    }
  }
  return ddm_local._4_4_;
}

Assistant:

int
Cudd_bddPickOneCube(
  DdManager * ddm,
  DdNode * node,
  char * string)
{
    DdNode *N, *T, *E;
    DdNode *one, *bzero;
    char   dir;
    int    i;

    if (string == NULL || node == NULL) return(0);

    /* The constant 0 function has no on-set cubes. */
    one = DD_ONE(ddm);
    bzero = Cudd_Not(one);
    if (node == bzero) return(0);

    for (i = 0; i < ddm->size; i++) string[i] = 2;

    for (;;) {

        if (node == one) break;

        N = Cudd_Regular(node);

        T = cuddT(N); E = cuddE(N);
        if (Cudd_IsComplement(node)) {
            T = Cudd_Not(T); E = Cudd_Not(E);
        }
        if (T == bzero) {
            string[N->index] = 0;
            node = E;
        } else if (E == bzero) {
            string[N->index] = 1;
            node = T;
        } else {
            dir = (char) ((Cudd_Random() & 0x2000) >> 13);
            string[N->index] = dir;
            node = dir ? T : E;
        }
    }
    return(1);

}